

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_make_string_op(sexp ctx,sexp self,sexp_sint_t n,sexp len,sexp ch)

{
  sexp psVar1;
  uchar *p;
  ulong uVar2;
  uint c;
  long lVar3;
  bool bVar4;
  sexp local_60;
  sexp_conflict local_58;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  local_58 = (sexp_conflict)0x43e;
  if ((((ulong)ch & 0xff) == 0x1e) &&
     (c = (uint)((ulong)ch >> 8), ch = (sexp)(((long)ch << 0x18) >> 0x1f | 1), 0x7f < (int)c)) {
    if (((ulong)len & 1) == 0) {
      psVar1 = sexp_type_exception(ctx,self,2,len);
      return psVar1;
    }
    uVar2 = 2;
    if (0x7ff < c) {
      uVar2 = (ulong)(4 - (c < 0x10000));
    }
    psVar1 = sexp_make_bytes_op(ctx,self,n,(sexp)((long)((long)&len[-1].value + 0x60bf) * uVar2 | 1)
                                ,(sexp)&DAT_0000043e);
    if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0x13)) {
      return psVar1;
    }
    p = &(psVar1->value).uvector.element_type;
    lVar3 = 0;
    local_60 = psVar1;
    if (0 < (long)len >> 1) {
      lVar3 = (long)len >> 1;
    }
    while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
      sexp_utf8_encode_char(p,(int)uVar2,c);
      p = p + uVar2;
    }
  }
  else {
    psVar1 = sexp_make_bytes_op(ctx,self,n,len,ch);
    local_60 = psVar1;
  }
  if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 0x13)) {
    local_40.var = &local_60;
    local_50.next = &local_40;
    local_40.next = (ctx->value).context.saves;
    local_50.var = &local_58;
    (ctx->value).context.saves = &local_50;
    psVar1 = sexp_alloc_tagged_aux(ctx,0x20,9);
    (psVar1->value).type.name = local_60;
    (psVar1->value).type.cpl = (sexp)0x0;
    (psVar1->value).type.slots = (sexp)(local_60->value).flonum;
    (ctx->value).context.saves = local_40.next;
  }
  return psVar1;
}

Assistant:

sexp sexp_make_string_op (sexp ctx, sexp self, sexp_sint_t n, sexp len, sexp ch)
{
  sexp i = (sexp_charp(ch) ? sexp_make_fixnum(sexp_unbox_character(ch)) : ch);
#if SEXP_USE_PACKED_STRINGS
  sexp b;
#else
  sexp_gc_var2(b, s);
#endif
#if SEXP_USE_UTF8_STRINGS
  int j, clen;
  if (sexp_charp(ch) && (sexp_unbox_character(ch) >= 0x80)) {
    sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, len);
    clen = sexp_utf8_char_byte_count(sexp_unbox_character(ch));
    b = sexp_make_bytes_op(ctx, self, n,
                           sexp_fx_mul(len, sexp_make_fixnum(clen)), SEXP_VOID);
    if (sexp_exceptionp(b)) return b;
    for (j=0; j<sexp_unbox_fixnum(len); j++)
      sexp_utf8_encode_char((unsigned char*)sexp_bytes_data(b)+(j*clen), clen,
                            sexp_unbox_character(ch));
  } else
#endif
  b = sexp_make_bytes_op(ctx, self, n, len, i);
  if (sexp_exceptionp(b)) return b;
#if SEXP_USE_PACKED_STRINGS
  sexp_pointer_tag(b) = SEXP_STRING;
  return b;
#else
  sexp_gc_preserve2(ctx, b, s);
  s = sexp_alloc_type(ctx, string, SEXP_STRING);
  sexp_string_bytes(s) = b;
  sexp_string_offset(s) = 0;
  sexp_string_size(s) = sexp_bytes_length(b);
#if SEXP_USE_STRING_REF_CACHE
  sexp_cached_char_idx(s) = 0;
  sexp_cached_cursor(s) = sexp_make_string_cursor(0);
#endif
  sexp_update_string_index_lookup(ctx, s);
  sexp_gc_release2(ctx);
  return s;
#endif
}